

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall GlobOpt::CollectMemcopyLdElementI(GlobOpt *this,Instr *instr,Loop *loop)

{
  RealCount *pRVar1;
  Opnd *pOVar2;
  RegOpnd *baseOpnd;
  MemOpList *pMVar3;
  code *pcVar4;
  OpndKind OVar5;
  bool bVar6;
  bool bVar7;
  undefined4 *puVar8;
  StackSym *pSVar9;
  GlobOpt *this_00;
  InductionVariable *pIVar10;
  Type pSVar11;
  Type pSVar12;
  GlobOpt *this_01;
  SymID local_38;
  SymID local_34;
  SymID inductionSymID;
  
  OVar5 = IR::Opnd::GetKind(instr->m_src1);
  if (OVar5 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x7ae,"(instr->GetSrc1()->IsIndirOpnd())","instr->GetSrc1()->IsIndirOpnd()")
    ;
    if (!bVar6) goto LAB_0044ba75;
    *puVar8 = 0;
  }
  pOVar2 = instr->m_src1;
  OVar5 = IR::Opnd::GetKind(pOVar2);
  if (OVar5 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar6) goto LAB_0044ba75;
    *puVar8 = 0;
  }
  baseOpnd = (RegOpnd *)pOVar2[1]._vptr_Opnd;
  this_01 = *(GlobOpt **)&pOVar2[1].m_valueType;
  OVar5 = IR::Opnd::GetKind((Opnd *)baseOpnd);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar6) goto LAB_0044ba75;
    *puVar8 = 0;
  }
  pSVar9 = IR::Opnd::GetStackSym((Opnd *)baseOpnd);
  if (pSVar9 == (StackSym *)0x0) {
    pSVar9 = (StackSym *)0x0;
  }
  else if (pSVar9->m_type != TyVar) {
    pSVar9 = StackSym::GetVarEquivSym(pSVar9,(Func *)0x0);
  }
  if (pSVar9 == (StackSym *)0x0) {
    local_34 = 0xffffffff;
  }
  else {
    local_34 = (pSVar9->super_Sym).m_id;
  }
  bVar7 = false;
  bVar6 = IsAllowedForMemOpt(this,instr,false,baseOpnd,(Opnd *)this_01);
  if (bVar6) {
    this_00 = (GlobOpt *)IR::Opnd::GetStackSym((Opnd *)this_01);
    if (this_00 == (GlobOpt *)0x0) {
      this_00 = (GlobOpt *)0x0;
    }
    else if (*(IRType *)((long)&this_00->intConstantToValueMap + 4) != TyVar) {
      this_01 = this_00;
      this_00 = (GlobOpt *)StackSym::GetVarEquivSym((StackSym *)this_00,(Func *)0x0);
    }
    if (this_00 == (GlobOpt *)0x0) {
      local_38 = 0xffffffff;
    }
    else {
      local_38 = *(SymID *)&this_00->intConstantToStackSymMap;
    }
    pIVar10 = GetInductionVariable(this_01,local_38,loop);
    if (pIVar10 == (InductionVariable *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x7bb,"(IsSymIDInductionVariable(inductionSymID, loop))",
                         "IsSymIDInductionVariable(inductionSymID, loop)");
      if (!bVar6) goto LAB_0044ba75;
      *puVar8 = 0;
    }
    Loop::EnsureMemOpVariablesInitialized(loop);
    bVar6 = JsUtil::
            BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(loop->memOpInfo->inductionVariableChangeInfoMap,&local_38);
    pOVar2 = instr->m_dst;
    OVar5 = IR::Opnd::GetKind(pOVar2);
    if (OVar5 != OpndKindReg) {
      return false;
    }
    OVar5 = IR::Opnd::GetKind(pOVar2);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar7) goto LAB_0044ba75;
      *puVar8 = 0;
    }
    pSVar9 = IR::Opnd::GetStackSym(pOVar2);
    bVar7 = false;
    if (((pSVar9->field_0x18 & 1) != 0) && ((pSVar9->field_5).m_instrDef != (Instr *)0x0)) {
      pSVar11 = (Type)new<Memory::JitArenaAllocator>(0x28,this->func->topFunc->m_fg->alloc,0x3f1274)
      ;
      *(undefined4 *)((long)&pSVar11[1].next + 4) = 1;
      *(SymID *)&pSVar11[2].next = local_34;
      *(undefined1 *)&pSVar11[4].next = 1;
      *(undefined1 *)&pSVar11[1].next = 0;
      *(bool *)((long)&pSVar11[1].next + 1) = bVar6;
      *(undefined4 *)&pSVar11->next = 0xffffffff;
      *(SymID *)((long)&pSVar11->next + 4) = local_38;
      OVar5 = IR::Opnd::GetKind(pOVar2);
      if (OVar5 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar6) {
LAB_0044ba75:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar8 = 0;
      }
      pSVar9 = IR::Opnd::GetStackSym(pOVar2);
      pSVar11[3].next = (Type)pSVar9;
      pMVar3 = loop->memOpInfo->candidates;
      pSVar12 = (Type)new<Memory::ArenaAllocator>
                                (0x10,(pMVar3->
                                      super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>
                                      ).allocator,0x366bee);
      pSVar12[1].next = pSVar11;
      pSVar12->next =
           (pMVar3->super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>).
           super_SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>.
           super_SListNodeBase<Memory::ArenaAllocator>.next;
      (pMVar3->super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar12;
      pRVar1 = &(pMVar3->super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>).
                super_SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>.
                super_RealCount;
      pRVar1->count = pRVar1->count + 1;
      bVar7 = true;
    }
  }
  return bVar7;
}

Assistant:

bool
GlobOpt::CollectMemcopyLdElementI(IR::Instr *instr, Loop *loop)
{
    Assert(instr->GetSrc1()->IsIndirOpnd());

    IR::IndirOpnd *src1 = instr->GetSrc1()->AsIndirOpnd();
    IR::Opnd *indexOpnd = src1->GetIndexOpnd();
    IR::RegOpnd *baseOpnd = src1->GetBaseOpnd()->AsRegOpnd();
    SymID baseSymID = GetVarSymID(baseOpnd->GetStackSym());

    if (!IsAllowedForMemOpt(instr, false, baseOpnd, indexOpnd))
    {
        return false;
    }

    SymID inductionSymID = GetVarSymID(indexOpnd->GetStackSym());
    Assert(IsSymIDInductionVariable(inductionSymID, loop));

    loop->EnsureMemOpVariablesInitialized();
    bool isIndexPreIncr = loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(inductionSymID);

    IR::Opnd * dst = instr->GetDst();
    if (!dst->IsRegOpnd() || !dst->AsRegOpnd()->GetStackSym()->IsSingleDef())
    {
        return false;
    }

    Loop::MemCopyCandidate* memcopyInfo = memcopyInfo = JitAnewStruct(this->func->GetTopFunc()->m_fg->alloc, Loop::MemCopyCandidate);
    memcopyInfo->ldBase = baseSymID;
    memcopyInfo->ldCount = 1;
    memcopyInfo->count = 0;
    memcopyInfo->bIndexAlreadyChanged = isIndexPreIncr;
    memcopyInfo->base = Js::Constants::InvalidSymID; //need to find the stElem first
    memcopyInfo->index = inductionSymID;
    memcopyInfo->transferSym = dst->AsRegOpnd()->GetStackSym();
    loop->memOpInfo->candidates->Prepend(memcopyInfo);
    return true;
}